

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

bool __thiscall SNMPPacket::build(SNMPPacket *this)

{
  bool bVar1;
  ComplexType *pCVar2;
  element_type *peVar3;
  shared_ptr<BER_CONTAINER> local_1e8;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [8];
  shared_ptr<ComplexType> varBindList;
  shared_ptr<BER_CONTAINER> local_180;
  undefined1 local_170 [32];
  shared_ptr<BER_CONTAINER> local_150;
  undefined1 local_140 [32];
  shared_ptr<BER_CONTAINER> local_120;
  undefined1 local_110 [32];
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  shared_ptr<ComplexType> snmpPDU;
  shared_ptr<OctetType> local_c8;
  shared_ptr<BER_CONTAINER> local_b8;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  shared_ptr<BER_CONTAINER> local_68;
  undefined1 local_58 [32];
  ComplexType local_38;
  SNMPPacket *this_local;
  
  local_38.values.
  super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (this->packet != (ComplexType *)0x0) {
    (*(this->packet->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  pCVar2 = (ComplexType *)operator_new(0x28);
  ComplexType::ComplexType(pCVar2,STRUCTURE);
  this->packet = pCVar2;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->snmpVersionPtr);
  if (bVar1) {
    pCVar2 = this->packet;
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_58 + 0x10),&this->snmpVersionPtr);
    ComplexType::addValueToList(&local_38,(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&local_38);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_58 + 0x10));
  }
  else {
    pCVar2 = this->packet;
    std::make_shared<IntegerType,SnmpVersionEnum&>((SnmpVersionEnum *)(local_88 + 0x10));
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              (&local_68,(shared_ptr<IntegerType> *)(local_88 + 0x10));
    ComplexType::addValueToList((ComplexType *)local_58,(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_58)
    ;
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&local_68);
    Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr
              ((shared_ptr<IntegerType> *)(local_88 + 0x10));
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->communityStringPtr);
  if (bVar1) {
    pCVar2 = this->packet;
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OctetType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_a8 + 0x10),&this->communityStringPtr);
    ComplexType::addValueToList((ComplexType *)local_88,(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_88)
    ;
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_a8 + 0x10));
  }
  else {
    pCVar2 = this->packet;
    snmpPDU.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::c_str();
    std::make_shared<OctetType,char_const*>((char **)&local_c8);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OctetType,void>(&local_b8,&local_c8);
    ComplexType::addValueToList((ComplexType *)local_a8,(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_a8)
    ;
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&local_b8);
    Catch::clara::std::shared_ptr<OctetType>::~shared_ptr(&local_c8);
  }
  std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE&>((ASN_TYPE_WITH_VALUE *)local_e0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->requestIDPtr);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e0);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_110 + 0x10),&this->requestIDPtr);
    ComplexType::addValueToList((ComplexType *)local_f0,(shared_ptr<BER_CONTAINER> *)peVar3);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_f0)
    ;
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_110 + 0x10));
  }
  else {
    peVar3 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e0);
    std::make_shared<IntegerType,unsigned_long&>((unsigned_long *)(local_140 + 0x10));
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              (&local_120,(shared_ptr<IntegerType> *)(local_140 + 0x10));
    ComplexType::addValueToList((ComplexType *)local_110,(shared_ptr<BER_CONTAINER> *)peVar3);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_110);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&local_120);
    Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr
              ((shared_ptr<IntegerType> *)(local_140 + 0x10));
  }
  peVar3 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  std::make_shared<IntegerType,ERROR_STATUS_WITH_VALUE&>
            ((ERROR_STATUS_WITH_VALUE *)(local_170 + 0x10));
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
            (&local_150,(shared_ptr<IntegerType> *)(local_170 + 0x10));
  ComplexType::addValueToList((ComplexType *)local_140,(shared_ptr<BER_CONTAINER> *)peVar3);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_140);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_150)
  ;
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr
            ((shared_ptr<IntegerType> *)(local_170 + 0x10));
  peVar3 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_e0);
  std::make_shared<IntegerType,int&>
            ((int *)&varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
            (&local_180,
             (shared_ptr<IntegerType> *)
             &varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ComplexType::addValueToList((ComplexType *)local_170,(shared_ptr<BER_CONTAINER> *)peVar3);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_170);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_180)
  ;
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr
            ((shared_ptr<IntegerType> *)
             &varBindList.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (*this->_vptr_SNMPPacket[3])(local_1a0);
  this_local._7_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
  if ((bool)this_local._7_1_) {
    peVar3 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e0);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_1d8 + 0x10),(shared_ptr<ComplexType> *)local_1a0)
    ;
    ComplexType::addValueToList((ComplexType *)local_1b8,(shared_ptr<BER_CONTAINER> *)peVar3);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_1b8);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)(local_1d8 + 0x10));
    pCVar2 = this->packet;
    std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
              (&local_1e8,(shared_ptr<ComplexType> *)local_e0);
    ComplexType::addValueToList((ComplexType *)local_1d8,(shared_ptr<BER_CONTAINER> *)pCVar2);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)local_1d8);
    Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
              ((shared_ptr<BER_CONTAINER> *)&local_1e8);
  }
  local_1b8._20_4_ = 1;
  std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_1a0);
  std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_e0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SNMPPacket::build(){
    // Delete the existing packet if we've built it before (generally only traps)
    delete this->packet;

    this->packet = new ComplexType(STRUCTURE);
    // Try to reuse existing containers if we got em
    if(this->snmpVersionPtr)
        this->packet->addValueToList(this->snmpVersionPtr);
    else
        this->packet->addValueToList(std::make_shared<IntegerType>(this->snmpVersion));

    if(this->communityStringPtr)
        this->packet->addValueToList(this->communityStringPtr);
    else
        this->packet->addValueToList(std::make_shared<OctetType>(this->communityString.c_str()));

    auto snmpPDU = std::make_shared<ComplexType>(this->packetPDUType);

    if(this->requestIDPtr)
        snmpPDU->addValueToList(this->requestIDPtr);
    else
        snmpPDU->addValueToList(std::make_shared<IntegerType>(this->requestID));


    snmpPDU->addValueToList(std::make_shared<IntegerType>(this->errorStatus.errorStatus));
    snmpPDU->addValueToList(std::make_shared<IntegerType>(this->errorIndex.errorIndex));

    // We need to do this dynamically incase we're building a trap, generateVarBindList is virtual
    auto varBindList = this->generateVarBindList();
    if(!varBindList) return false;
    
    snmpPDU->addValueToList(varBindList);

    this->packet->addValueToList(snmpPDU);

    return true;
}